

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int decode_new_session_ticket
              (ptls_t *tls,uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *nonce,
              ptls_iovec_t *ticket,uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  ushort *puVar1;
  st_ptls_on_extension_t *psVar2;
  bool bVar3;
  uint uVar4;
  ushort extid;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ushort *puVar10;
  ushort *puVar11;
  ushort *puVar12;
  ushort *puVar13;
  ptls_iovec_t pVar14;
  st_ptls_extension_bitmap_t local_38;
  
  if ((long)end - (long)src < 4) {
    return 0x32;
  }
  uVar5 = *(uint *)src;
  *lifetime = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  if ((long)end - (long)(src + 4) < 4) {
    return 0x32;
  }
  uVar5 = *(uint *)(src + 4);
  *age_add = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  puVar11 = (ushort *)(src + 8);
  uVar5 = 0x32;
  if (puVar11 == (ushort *)end) {
    bVar3 = false;
  }
  else {
    uVar8 = (ulong)(byte)*puVar11;
    puVar11 = (ushort *)(src + 9);
    bVar3 = false;
    if (uVar8 <= (ulong)((long)end - (long)puVar11)) {
      nonce->base = (uint8_t *)puVar11;
      puVar11 = (ushort *)((long)puVar11 + uVar8);
      nonce->len = uVar8;
      bVar3 = true;
      uVar5 = 0;
    }
  }
  if (!bVar3) {
    return uVar5;
  }
  uVar7 = 0x32;
  if (1 < (ulong)((long)end - (long)puVar11)) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      uVar8 = (ulong)*(byte *)((long)puVar11 + lVar9) | uVar8 << 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 2);
    puVar11 = puVar11 + 1;
    if (uVar8 - 1 < (ulong)((long)end - (long)puVar11)) {
      ticket->base = (uint8_t *)puVar11;
      puVar11 = (ushort *)((long)puVar11 + uVar8);
      ticket->len = uVar8;
      bVar3 = true;
      uVar7 = uVar5;
      goto LAB_0011fbad;
    }
  }
  bVar3 = false;
LAB_0011fbad:
  if (bVar3) {
    *max_early_data_size = 0;
    local_38.bits = 0;
    uVar5 = 0x32;
    if ((ulong)((long)end - (long)puVar11) < 2) {
      bVar3 = false;
      puVar12 = puVar11;
    }
    else {
      lVar9 = 0;
      uVar8 = 0;
      do {
        uVar8 = (ulong)*(byte *)((long)puVar11 + lVar9) | uVar8 << 8;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 2);
      puVar12 = puVar11 + 1;
      uVar5 = 0x32;
      if ((ulong)((long)end - (long)puVar12) < uVar8) {
LAB_0011fc0f:
        bVar3 = false;
      }
      else {
        uVar5 = uVar7;
        if (uVar8 != 0) {
          puVar11 = (ushort *)((long)puVar11 + uVar8 + 2);
          puVar13 = puVar12;
          do {
            if ((long)puVar11 - (long)puVar13 < 2) {
              uVar5 = 0x32;
              puVar12 = puVar13;
              goto LAB_0011fc0f;
            }
            extid = *puVar13 << 8 | *puVar13 >> 8;
            puVar12 = puVar13 + 1;
            iVar6 = extension_bitmap_testandset(&local_38,4,extid);
            if (iVar6 == 0) {
              uVar5 = 0x2f;
              goto LAB_0011fc0f;
            }
            uVar5 = 0x32;
            if ((ulong)((long)puVar11 - (long)puVar12) < 2) {
              uVar7 = 0;
            }
            else {
              lVar9 = 0;
              uVar8 = 0;
              do {
                uVar8 = (ulong)*(byte *)((long)puVar12 + lVar9) | uVar8 << 8;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 2);
              puVar12 = puVar13 + 2;
              uVar7 = 0;
              if (uVar8 <= (ulong)((long)puVar11 - (long)puVar12)) {
                psVar2 = tls->ctx->on_extension;
                uVar5 = uVar7;
                if (psVar2 != (st_ptls_on_extension_t *)0x0) {
                  pVar14.len = uVar8;
                  pVar14.base = (uint8_t *)puVar12;
                  iVar6 = (*psVar2->cb)(psVar2,tls,'\x04',extid,pVar14);
                  uVar5 = (uint)(iVar6 != 0);
                  if (iVar6 != 0) {
                    uVar7 = 0;
                    goto LAB_0011fd5b;
                  }
                }
                puVar1 = (ushort *)((long)puVar12 + uVar8);
                puVar10 = puVar1;
                uVar4 = uVar5;
                if (extid == 0x2a) {
                  uVar5 = 0x32;
                  puVar10 = puVar12;
                  if (3 < (long)uVar8) {
                    uVar5 = *(uint *)(puVar13 + 2);
                    *max_early_data_size =
                         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                         uVar5 << 0x18;
                    puVar10 = puVar13 + 4;
                    uVar5 = 0;
                  }
                  uVar7 = 0;
                  puVar12 = puVar10;
                  uVar4 = 0;
                  if ((long)uVar8 < 4) goto LAB_0011fd5b;
                }
                uVar5 = uVar4;
                uVar7 = (uint)(puVar10 == puVar1);
                puVar12 = puVar10;
                if (puVar10 != puVar1) {
                  uVar5 = 0x32;
                }
              }
            }
LAB_0011fd5b:
            if ((char)uVar7 == '\0') goto LAB_0011fc0f;
            puVar13 = puVar12;
          } while (puVar12 != puVar11);
        }
        bVar3 = true;
      }
    }
    uVar7 = uVar5;
    if (bVar3) {
      uVar7 = 0x32;
      if (puVar12 == (ushort *)end) {
        uVar7 = 0;
      }
    }
  }
  return uVar7;
}

Assistant:

static int decode_new_session_ticket(ptls_t *tls, uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *nonce, ptls_iovec_t *ticket,
                                     uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t exttype;
    int ret;

    if ((ret = ptls_decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode32(age_add, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 1, {
        *nonce = ptls_iovec_init(src, end - src);
        src = end;
    });
    ptls_decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if ((ret = ptls_decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}